

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GC.cpp
# Opt level: O1

String * __thiscall luna::GC::NewString(GC *this,GCGeneration gen)

{
  String *this_00;
  
  this_00 = (String *)operator_new(0x38);
  String::String(this_00);
  (this_00->super_GCObject).field_0x10 = (this_00->super_GCObject).field_0x10 & 0xf | 0x50;
  SetObjectGen(this,(GCObject *)this_00,gen);
  return this_00;
}

Assistant:

String * GC::NewString(GCGeneration gen)
    {
        auto s = new String;
        s->gc_obj_type_ = GCObjectType_String;
        SetObjectGen(s, gen);
        return s;
    }